

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile_stream_and_dir.hpp
# Opt level: O0

int32_t __thiscall
CompoundFile::Stream::whereIsShortSector(Stream *this,SecID *shortSector,SecID *largeSector)

{
  int32_t iVar1;
  int32_t iVar2;
  int iVar3;
  reference pvVar4;
  int32_t *in_RDX;
  SecID *in_RSI;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *in_RDI;
  int32_t largeSectorIdx;
  int32_t offset;
  int32_t shortSectorsInLarge;
  undefined4 in_stack_ffffffffffffffc8;
  
  iVar1 = Header::sectorSize((Header *)
                             (in_RDI->
                             super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                             )._M_impl.super__Vector_impl_data._M_end_of_storage);
  iVar2 = Header::shortSectorSize
                    ((Header *)
                     (in_RDI->
                     super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>).
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  iVar3 = iVar1 / iVar2;
  iVar2 = SecID::operator_cast_to_int(in_RSI);
  SecID::operator_cast_to_int(in_RSI);
  pvVar4 = std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::at
                     (in_RDI,CONCAT44(iVar1,in_stack_ffffffffffffffc8));
  *in_RDX = pvVar4->m_id;
  return iVar2 % iVar3;
}

Assistant:

inline int32_t
Stream::whereIsShortSector( const SecID & shortSector,
	SecID & largeSector )
{
	const int32_t shortSectorsInLarge =
		m_header.sectorSize() / m_header.shortSectorSize();

	const int32_t offset = shortSector % shortSectorsInLarge;

	const int32_t largeSectorIdx = shortSector / shortSectorsInLarge;

	largeSector = m_largeStreamChain.at( largeSectorIdx );

	return offset;
}